

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O3

void yyTraceShift(yyParser_conflict *yypParser,int yyNewState)

{
  if (yyTraceFILE == (FILE *)0x0) {
    return;
  }
  if (yyNewState < 0xf5) {
    fprintf((FILE *)yyTraceFILE,"%sShift \'%s\', go to state %d\n",yyTracePrompt,
            yyTokenName[yypParser->yystack[yypParser->yyidx].major],(ulong)(uint)yyNewState);
    return;
  }
  fprintf((FILE *)yyTraceFILE,"%sShift \'%s\'\n",yyTracePrompt,
          yyTokenName[yypParser->yystack[yypParser->yyidx].major],(ulong)(uint)yyNewState);
  return;
}

Assistant:

static void yyTraceShift(yyParser *yypParser, int yyNewState){
  if( yyTraceFILE ){
    if( yyNewState<YYNSTATE ){
      fprintf(yyTraceFILE,"%sShift '%s', go to state %d\n",
         yyTracePrompt,yyTokenName[yypParser->yystack[yypParser->yyidx].major],
         yyNewState);
    }else{
      fprintf(yyTraceFILE,"%sShift '%s'\n",
         yyTracePrompt,yyTokenName[yypParser->yystack[yypParser->yyidx].major]);
    }
  }
}